

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.hpp
# Opt level: O2

ostream * operator<<(ostream *os,
                    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *property)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,(string *)(property + 0x20));
  poVar1 = std::operator<<(poVar1," = ");
  std::operator<<(poVar1,(string *)property);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::tuple<std::string, std::string> &property) {
  os << std::get<0>(property) << " = " << std::get<1>(property);
  return os;
}